

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void anon_unknown.dwarf_11bb3::WriteAttributeToMemory
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,char *name,char *type,
               uchar *data,int len)

{
  const_iterator cVar1;
  size_t sVar2;
  int outLen;
  uchar local_34 [4];
  
  cVar1._M_current =
       (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  sVar2 = strlen(name);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,cVar1,name,name + sVar2 + 1)
  ;
  cVar1._M_current =
       (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  sVar2 = strlen(type);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,cVar1,type,type + sVar2 + 1)
  ;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
             (const_iterator)
             (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,local_34,&stack0xffffffffffffffd0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
             (const_iterator)
             (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,data,data + len);
  return;
}

Assistant:

void WriteAttributeToMemory(std::vector<unsigned char> &out, const char *name,
                            const char *type, const unsigned char *data,
                            int len) {
  out.insert(out.end(), name, name + strlen(name) + 1);
  out.insert(out.end(), type, type + strlen(type) + 1);

  int outLen = len;
  if (IsBigEndian()) {
    swap4(reinterpret_cast<unsigned int *>(&outLen));
  }
  out.insert(out.end(), reinterpret_cast<unsigned char *>(&outLen),
             reinterpret_cast<unsigned char *>(&outLen) + sizeof(int));
  out.insert(out.end(), data, data + len);
}